

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O3

int xmlSerializeHexCharRef(char *buf,int val)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  char cVar7;
  int iVar8;
  
  buf[0] = '&';
  buf[1] = '#';
  uVar2 = val & 0xff0000;
  uVar5 = val & 0xff00;
  uVar6 = uVar5;
  if (uVar5 == 0) {
    uVar6 = val;
  }
  iVar8 = 0x10;
  if (uVar2 == 0) {
    iVar8 = (uint)(uVar5 != 0) << 3;
  }
  buf[2] = 'x';
  if (uVar2 != 0) {
    uVar6 = uVar2;
  }
  iVar4 = iVar8 + 4;
  if ((uVar6 & 0xf0f0f0) == 0) {
    iVar4 = iVar8;
  }
  lVar3 = 3;
  do {
    uVar6 = val >> ((byte)iVar4 & 0x1f) & 0xf;
    cVar1 = (char)uVar6;
    cVar7 = cVar1 + '7';
    if (uVar6 < 10) {
      cVar7 = cVar1 + '0';
    }
    buf[lVar3] = cVar7;
    iVar4 = iVar4 + -4;
    lVar3 = lVar3 + 1;
  } while (iVar4 != -4);
  buf[lVar3] = ';';
  return (int)lVar3 + 1;
}

Assistant:

int
xmlSerializeHexCharRef(char *buf, int val) {
    char *out = buf;
    int shift = 0, bits;

    *out++ = '&';
    *out++ = '#';
    *out++ = 'x';

    bits = val;
    if (bits & 0xFF0000) {
        shift = 16;
        bits &= 0xFF0000;
    } else if (bits & 0x00FF00) {
        shift = 8;
        bits &= 0x00FF00;
    }
    if (bits & 0xF0F0F0) {
        shift += 4;
    }

    do {
        int d = (val >> shift) & 0x0F;

        if (d < 10)
            *out++ = '0' + d;
        else
            *out++ = 'A' + (d - 10);

	shift -= 4;
    } while (shift >= 0);

    *out++ = ';';

    return(out - buf);
}